

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O3

void __thiscall
asmjit::_abi_1_10::ZoneStackBase::_cleanupBlock
          (ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  Block *pBVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sbyte sVar4;
  Error EVar5;
  ZoneAllocator *__dest;
  ZoneAllocator *pZVar6;
  ZoneAllocator *extraout_RAX;
  ZoneAllocator *pZVar7;
  sbyte sVar8;
  ulong uVar9;
  uint extraout_EDX;
  uint sizeOfT;
  uint extraout_EDX_00;
  void *pvVar10;
  long *extraout_RDX;
  Slot *pSVar11;
  uint uVar12;
  uint uVar13;
  ZoneAllocator *unaff_RBX;
  ulong uVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  ZoneAllocator *pZVar17;
  ZoneAllocator *allocator;
  ZoneAllocator *pZVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ZoneAllocator *pZVar22;
  ZoneAllocator *unaff_R13;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uStack_124;
  ulong uStack_120;
  ZoneAllocator *pZStack_118;
  ZoneAllocator *pZStack_110;
  ulong uStack_108;
  long *plStack_100;
  ZoneAllocator *pZStack_f8;
  ulong uStack_f0;
  ZoneAllocator *pZStack_e8;
  ZoneAllocator *pZStack_e0;
  ulong uStack_d8;
  ZoneAllocator *pZStack_c8;
  ZoneAllocator *pZStack_c0;
  long *plStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  ZoneAllocator *pZStack_98;
  ZoneAllocator *pZStack_90;
  ulong uStack_88;
  code *pcStack_80;
  ZoneAllocator *pZStack_70;
  ZoneAllocator *pZStack_68;
  ZoneAllocator *pZStack_60;
  ulong uStack_58;
  ZoneAllocator *pZStack_48;
  ulong uStack_40;
  ulong uVar16;
  
  pZVar17 = (ZoneAllocator *)CONCAT44(in_register_00000034,side);
  pBVar1 = this->_block[side];
  __dest = (ZoneAllocator *)pBVar1->_start;
  if (__dest == (ZoneAllocator *)pBVar1->_end) {
    __dest = (ZoneAllocator *)(ulong)(side == 0);
    pZVar17 = (ZoneAllocator *)pBVar1->_link[(long)__dest];
    if (pZVar17 == (ZoneAllocator *)0x0) {
      if (this->_block[(long)__dest] == pBVar1) {
        pvVar10 = (void *)((long)pBVar1->_link + middleIndex);
        pBVar1->_start = pvVar10;
        pBVar1->_end = pvVar10;
      }
      return;
    }
    if ((Block *)pZVar17->_slots[(ulong)side - 1] != pBVar1) goto LAB_00129e28;
    pZVar22 = this->_allocator;
    if (pZVar22->_zone != (Zone *)0x0) {
      pBVar1->_link[0] = (Block *)pZVar22->_slots[9];
      pZVar22->_slots[9] = (Slot *)pBVar1;
      pZVar17->_slots[(ulong)side - 1] = (Slot *)0x0;
      this->_block[side] = (Block *)pZVar17;
      return;
    }
  }
  else {
    _cleanupBlock();
LAB_00129e28:
    _cleanupBlock();
  }
  _cleanupBlock();
  uVar13 = *(uint *)((long)((ZoneAllocator *)this)->_slots + 4);
  uVar21 = (ulong)uVar13;
  uVar19 = 0;
  if (side <= uVar13) {
    return;
  }
  pZVar22 = (ZoneAllocator *)(ulong)extraout_EDX;
  if (side * extraout_EDX < side) {
    return;
  }
  if (pZVar17->_zone == (Zone *)0x0) {
    uStack_58 = 0x129f70;
    allocator = pZVar17;
    ZoneVectorBase::_reserve();
    pZVar18 = (ZoneAllocator *)this;
LAB_00129f70:
    uStack_58 = 0x129f75;
    ZoneVectorBase::_reserve();
LAB_00129f75:
    uStack_58 = 0x129f7a;
    ZoneVectorBase::_reserve();
  }
  else {
    uStack_58 = 0x129e82;
    uVar19 = 0;
    __dest = (ZoneAllocator *)ZoneAllocator::_alloc(pZVar17,(ulong)(side * extraout_EDX),&uStack_40)
    ;
    if (__dest == (ZoneAllocator *)0x0) {
      return;
    }
    allocator = (ZoneAllocator *)((ZoneAllocator *)this)->_zone;
    pZVar18 = pZVar22;
    if ((ulong)*(uint *)((ZoneAllocator *)this)->_slots != 0) {
      uStack_58 = 0x129eb3;
      pZStack_48 = pZVar22;
      memcpy(__dest,allocator,(ulong)*(uint *)((ZoneAllocator *)this)->_slots * (long)pZVar22);
      pZVar18 = pZStack_48;
      unaff_R13 = allocator;
      pZVar22 = __dest;
    }
    unaff_RBX = (ZoneAllocator *)this;
    if (allocator == (ZoneAllocator *)0x0) {
LAB_00129f3d:
      uVar19 = 0;
      uVar13 = (uint)(uStack_40 / (ulong)pZVar18);
      *(uint *)((long)((ZoneAllocator *)this)->_slots + 4) = uVar13;
      if (side <= uVar13) {
        ((ZoneAllocator *)this)->_zone = (Zone *)__dest;
        return;
      }
      goto LAB_00129f70;
    }
    if (pZVar17->_zone == (Zone *)0x0) goto LAB_00129f75;
    uVar21 = uVar21 * (long)pZVar18;
    if (uVar21 != 0) {
      if (uVar21 < 0x201) {
        if (uVar21 < 0x81) {
          uVar21 = uVar21 + 0x1fffffffff >> 5;
        }
        else {
          uVar21 = (uVar21 + 0x3fffffff7f >> 6) + 4;
        }
        allocator->_zone = (Zone *)pZVar17->_slots[uVar21 & 0xffffffff];
        pZVar17->_slots[uVar21 & 0xffffffff] = (Slot *)allocator;
      }
      else {
        uStack_58 = 0x129f10;
        ZoneAllocator::_releaseDynamic(pZVar17,allocator,uVar21);
        unaff_R13 = pZVar18;
        pZVar22 = __dest;
      }
      goto LAB_00129f3d;
    }
  }
  uStack_58 = 0x129f7f;
  ZoneVectorBase::_reserve();
  uVar14 = (ulong)sizeOfT;
  uVar13 = *(uint *)pZVar18->_slots;
  uStack_88 = (ulong)uVar13;
  pZStack_70 = unaff_RBX;
  pZStack_68 = pZVar17;
  pZStack_60 = pZVar22;
  uStack_58 = (ulong)side;
  if (uVar19 <= *(uint *)((long)pZVar18->_slots + 4)) {
LAB_00129f97:
    if (uVar13 < uVar19) {
      pcStack_80 = (code *)0x129fb8;
      memset((uint8_t **)((long)&pZVar18->_zone->_ptr + uStack_88 * uVar14),0,
             (uVar19 - uVar13) * uVar14);
    }
    *(uint *)pZVar18->_slots = uVar19;
    return;
  }
  pcStack_80 = (code *)0x129fd8;
  pZVar17 = pZVar18;
  EVar5 = ZoneVectorBase::_grow((ZoneVectorBase *)pZVar18,allocator,sizeOfT,uVar19 - uVar13);
  uVar9 = (ulong)EVar5;
  if (EVar5 != 0) {
    return;
  }
  if (uVar19 <= *(uint *)((long)pZVar18->_slots + 4)) goto LAB_00129f97;
  pcStack_80 = ZoneBitVector::copyFrom;
  ZoneVectorBase::_resize();
  uVar13 = *(uint *)(extraout_RDX + 1);
  pZVar22 = (ZoneAllocator *)(ulong)uVar13;
  if (uVar13 == 0) {
    *(undefined4 *)pZVar17->_slots = 0;
    return;
  }
  pZVar7 = (ZoneAllocator *)pZVar17->_zone;
  uVar15 = uVar13 + 0x3f;
  uVar16 = (ulong)uVar15;
  plStack_b8 = extraout_RDX;
  pZVar6 = pZVar7;
  if (uVar13 <= *(uint *)((long)pZVar17->_slots + 4)) goto LAB_0012a08e;
  uVar12 = uVar15 & 0xffffffc0;
  if (uVar12 < uVar13) {
    return;
  }
  uStack_a8 = (ulong)uVar19;
  uStack_a0 = uVar21;
  pZStack_98 = unaff_R13;
  pZStack_90 = pZVar18;
  pcStack_80 = (code *)uVar14;
  if (allocator->_zone == (Zone *)0x0) {
    uStack_d8 = 0x12a101;
    allocator = pZVar17;
    ZoneBitVector::copyFrom();
    pZVar6 = extraout_RAX;
LAB_0012a101:
    uVar21 = (ulong)uVar12;
  }
  else {
    uStack_d8 = 0x12a05a;
    pZStack_c0 = allocator;
    pZVar6 = (ZoneAllocator *)ZoneAllocator::_alloc(allocator,(ulong)(uVar12 >> 3),&uStack_b0);
    if (pZVar6 == (ZoneAllocator *)0x0) {
      return;
    }
    uVar21 = uStack_b0 * 8;
    uVar9 = uStack_b0;
    if (uVar21 < uStack_b0) goto LAB_0012a101;
  }
  uVar19 = (uint)uVar9;
  if (pZVar7 == (ZoneAllocator *)0x0) {
LAB_0012a084:
    pZVar17->_zone = (Zone *)pZVar6;
    *(int *)((long)pZVar17->_slots + 4) = (int)uVar21;
LAB_0012a08e:
    *(uint *)pZVar17->_slots = uVar13;
    if (0x3f < uVar15) {
      lVar20 = *plStack_b8;
      uVar21 = 0;
      do {
        pZVar6->_slots[uVar21 - 1] = *(Slot **)(lVar20 + uVar21 * 8);
        uVar21 = uVar21 + 1;
      } while (uVar15 >> 6 != uVar21);
    }
    return;
  }
  pZVar18 = pZStack_c0;
  if (pZStack_c0->_zone == (Zone *)0x0) {
    uStack_d8 = 0x12a10e;
    ZoneBitVector::copyFrom();
  }
  else {
    uVar12 = *(uint *)((long)pZVar17->_slots + 4);
    allocator = (ZoneAllocator *)(ulong)uVar12;
    pZStack_c8 = pZVar6;
    if (7 < uVar12) {
      uStack_d8 = 0x12a0f5;
      ZoneBitVector::copyFrom();
      pZVar6 = pZStack_c8;
      goto LAB_0012a084;
    }
  }
  uStack_d8 = 0x12a113;
  ZoneBitVector::copyFrom();
  plStack_100 = plStack_b8;
  pZStack_f8 = pZVar22;
  uStack_f0 = uVar21;
  pZStack_e8 = pZVar7;
  pZStack_e0 = pZVar17;
  uStack_d8 = uVar16;
  if (uVar19 < extraout_EDX_00) {
    ZoneBitVector::_resize();
    pZVar6 = pZVar18;
    allocator = pZVar22;
LAB_0012a3b8:
    uVar13 = (uint)plStack_b8;
    ZoneBitVector::_resize();
LAB_0012a3bd:
    uVar14 = (ulong)uVar15;
LAB_0012a1ba:
    if (0x3f < uVar13 + 0x3f) {
      uVar21 = 0;
      do {
        pZVar7->_slots[uVar21 - 1] = pZVar17->_slots[uVar21 - 1];
        uVar21 = uVar21 + 1;
      } while (uVar13 + 0x3f >> 6 != uVar21);
LAB_0012a1f3:
      if (pZStack_118->_zone == (Zone *)0x0) {
        ZoneBitVector::_resize();
      }
      else {
        uVar19 = *(uint *)((long)allocator->_slots + 4);
        if (7 < uVar19) {
          uVar21 = (ulong)(uVar19 >> 3);
          if (uVar19 < 0x1008) {
            if (uVar19 < 0x408) {
              uVar21 = uVar21 + 0x1fffffffff >> 5;
            }
            else {
              uVar21 = (uVar21 + 0x3fffffff7f >> 6) + 4;
            }
            pZVar17->_zone = (Zone *)pZStack_118->_slots[uVar21 & 0xffffffff];
            pZStack_118->_slots[uVar21 & 0xffffffff] = (Slot *)pZVar17;
          }
          else {
            ZoneAllocator::_releaseDynamic(pZStack_118,pZVar17,uVar21);
          }
          goto LAB_0012a264;
        }
      }
      ZoneBitVector::_resize();
      goto LAB_0012a3cf;
    }
    if (pZVar17 != (ZoneAllocator *)0x0) goto LAB_0012a1f3;
LAB_0012a264:
    allocator->_zone = (Zone *)pZVar7;
    *(int *)((long)allocator->_slots + 4) = (int)uVar14;
    __dest = (ZoneAllocator *)(ulong)uStack_124;
    pZVar6 = pZStack_110;
    uVar21 = uStack_120;
    pZVar17 = pZVar7;
  }
  else {
    uVar21 = (ulong)extraout_EDX_00;
    pZStack_110 = (ZoneAllocator *)allocator->_slots;
    uVar13 = *(uint *)allocator->_slots;
    plStack_b8 = (long *)(ulong)uVar13;
    if (extraout_EDX_00 <= uVar13) {
      ZoneBitVector::_resize();
      return;
    }
    pZVar17 = (ZoneAllocator *)allocator->_zone;
    pZVar6 = pZStack_110;
    if (*(uint *)((long)allocator->_slots + 4) < extraout_EDX_00) {
      uStack_124 = (uint)__dest;
      uVar15 = uVar19 + 0x3f & 0xffffffc0;
      if (uVar15 < extraout_EDX_00) {
        return;
      }
      if (pZVar18->_zone == (Zone *)0x0) goto LAB_0012a3b8;
      pZVar6 = (ZoneAllocator *)(ulong)(uVar15 >> 3);
      pZVar7 = (ZoneAllocator *)ZoneAllocator::_alloc(pZVar18,(size_t)pZVar6,&uStack_108);
      if (pZVar7 == (ZoneAllocator *)0x0) {
        return;
      }
      uVar14 = uStack_108 * 8;
      uStack_120 = uVar21;
      pZStack_118 = pZVar18;
      if (uVar14 < uStack_108) goto LAB_0012a3bd;
      goto LAB_0012a1ba;
    }
  }
  uVar19 = uVar13 >> 6;
  pZStack_118 = (ZoneAllocator *)(ulong)uVar19;
  uVar15 = (uint)uVar21;
  sVar4 = (sbyte)(uVar15 & 0x3f);
  pSVar11 = (Slot *)-((ulong)__dest & 0xff);
  uVar13 = uVar13 & 0x3f;
  if (uVar13 != 0) {
    sVar8 = 0;
    if ((uVar19 == ((uint)(uVar21 >> 6) & 0x3ffffff)) && (sVar8 = sVar4, (uVar15 & 0x3f) <= uVar13))
    {
LAB_0012a3cf:
      uVar13 = (uint)pZVar6;
      ZoneBitVector::_resize();
      uVar21 = 0x41;
      if (uVar13 < 0x41) {
        uVar21 = (ulong)uVar13;
      }
      String::_opString((String *)pZStack_118,kAppend,
                        "None" + arm::FormatterInternal::formatFeature::sFeatureIndex[uVar21],
                        0xffffffffffffffff);
      return;
    }
    pZVar17->_slots[(long)((long)&pZStack_118[-1]._dynamicBlocks + 7)] =
         (Slot *)((ulong)pZVar17->_slots[(long)((long)&pZStack_118[-1]._dynamicBlocks + 7)] |
                 (long)pSVar11 << (sVar8 - (char)uVar13 & 0x3fU));
    uVar19 = uVar19 + 1;
  }
  auVar3 = _DAT_0014bce0;
  auVar2 = _DAT_0014bcd0;
  uVar13 = uVar15 + 0x3f >> 6;
  if (uVar19 < uVar13) {
    uVar9 = (ulong)uVar19;
    lVar20 = (uVar13 - uVar9) + -1;
    auVar23._8_4_ = (int)lVar20;
    auVar23._0_8_ = lVar20;
    auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar14 = 0;
    auVar23 = auVar23 ^ _DAT_0014bce0;
    do {
      auVar24._8_4_ = (int)uVar14;
      auVar24._0_8_ = uVar14;
      auVar24._12_4_ = (int)(uVar14 >> 0x20);
      auVar24 = (auVar24 | auVar2) ^ auVar3;
      if ((bool)(~(auVar24._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar24._0_4_ ||
                  auVar23._4_4_ < auVar24._4_4_) & 1)) {
        pZVar17->_slots[uVar9 + (uVar14 - 1)] = pSVar11;
      }
      if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
          auVar24._12_4_ <= auVar23._12_4_) {
        pZVar17->_slots[uVar9 + uVar14] = pSVar11;
      }
      uVar14 = uVar14 + 2;
    } while (((uVar13 - uVar9) + 1 & 0xfffffffffffffffe) != uVar14);
  }
  if ((uVar21 & 0x3f) != 0) {
    pSVar11 = (Slot *)0x0;
    if ((char)__dest != '\0') {
      pSVar11 = (Slot *)~(-1L << sVar4);
    }
    pZVar17->_slots[(ulong)(uVar13 - 1) - 1] = pSVar11;
  }
  *(uint *)&pZVar6->_zone = uVar15;
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}